

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::~SimpleGraphicsPipelineBuilder
          (SimpleGraphicsPipelineBuilder *this)

{
  Move<vk::Handle<(vk::HandleType)14>_> *local_18;
  SimpleGraphicsPipelineBuilder_conflict *this_local;
  
  local_18 = (Move<vk::Handle<(vk::HandleType)14>_> *)&this->m_shaderStageCount;
  do {
    local_18 = local_18 + -1;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(local_18);
  } while (local_18 != this->m_shaderModules);
  return;
}

Assistant:

~SimpleGraphicsPipelineBuilder	(void) { }